

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O3

ssize_t __thiscall r_comp::Metadata::read(Metadata *this,int __fd,void *__buf,size_t __nbytes)

{
  Iteration IVar1;
  undefined1 *in_RAX;
  size_t sVar2;
  Class *pCVar3;
  mapped_type *pmVar4;
  undefined1 *extraout_RAX;
  long lVar5;
  undefined1 *extraout_RAX_00;
  undefined1 *extraout_RAX_01;
  undefined1 *extraout_RAX_02;
  undefined1 *extraout_RAX_03;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint *puVar6;
  ulong uVar7;
  long lVar8;
  Class c;
  undefined1 local_128 [24];
  char local_110 [16];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_100;
  ReturnType local_e8;
  Iteration IStack_e4;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_e0;
  value_type local_d8;
  value_type local_b8;
  value_type local_98;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_50;
  ReturnType local_38;
  Iteration IStack_34;
  
  puVar6 = (uint *)CONCAT44(in_register_00000034,__fd);
  uVar7 = (ulong)*puVar6;
  if (uVar7 == 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = 1;
    do {
      Class::Class((Class *)local_128,ANY);
      Class::read((Class *)local_128,__fd + (int)lVar8 * 4,__buf_00,__nbytes);
      local_78._0_4_ = local_128._0_4_;
      local_70._M_p = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_128._8_8_,(char *)(local_128._8_8_ + local_128._16_8_));
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                (&local_50,&local_100);
      local_38 = local_e8;
      IStack_34 = IStack_e4;
      std::vector<r_comp::Class,_std::allocator<r_comp::Class>_>::push_back
                (&(this->classes_by_opcodes).m_vector,(value_type *)local_78);
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                (&local_50);
      if (local_70._M_p != local_60) {
        operator_delete(local_70._M_p);
      }
      r_code::Atom::~Atom((Atom *)local_78);
      sVar2 = Class::get_size((Class *)local_128);
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                (&local_100);
      if ((char *)local_128._8_8_ != local_110) {
        operator_delete((void *)local_128._8_8_);
      }
      lVar8 = lVar8 + sVar2;
      in_RAX = (undefined1 *)r_code::Atom::~Atom((Atom *)local_128);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  uVar7 = (ulong)puVar6[lVar8];
  lVar5 = lVar8 + 1;
  if (uVar7 != 0) {
    do {
      r_code::ReadString_abi_cxx11_((uint *)local_128);
      lVar8 = r_code::GetStringSize((string *)local_128);
      lVar8 = lVar8 + lVar5;
      pCVar3 = r_code::vector<r_comp::Class>::operator[]
                         (&this->classes_by_opcodes,(ulong)puVar6[lVar8]);
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,(key_type *)local_128);
      r_code::Atom::operator=(&pmVar4->atom,&pCVar3->atom);
      std::__cxx11::string::_M_assign((string *)&pmVar4->str_opcode);
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::operator=
                (&pmVar4->things_to_read,&pCVar3->things_to_read);
      IVar1 = pCVar3->use_as;
      pmVar4->type = pCVar3->type;
      pmVar4->use_as = IVar1;
      in_RAX = local_128 + 0x10;
      if ((undefined1 *)CONCAT44(local_128._4_4_,local_128._0_4_) != in_RAX) {
        operator_delete((undefined1 *)CONCAT44(local_128._4_4_,local_128._0_4_));
        in_RAX = extraout_RAX;
      }
      lVar5 = lVar8 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  lVar8 = lVar8 + 2;
  uVar7 = (ulong)puVar6[lVar5];
  if (uVar7 != 0) {
    local_e0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->sys_classes;
    do {
      r_code::ReadString_abi_cxx11_((uint *)local_128);
      lVar5 = r_code::GetStringSize((string *)local_128);
      pCVar3 = r_code::vector<r_comp::Class>::operator[]
                         (&this->classes_by_opcodes,(ulong)puVar6[lVar5 + lVar8]);
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](local_e0,(key_type *)local_128);
      r_code::Atom::operator=(&pmVar4->atom,&pCVar3->atom);
      std::__cxx11::string::_M_assign((string *)&pmVar4->str_opcode);
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::operator=
                (&pmVar4->things_to_read,&pCVar3->things_to_read);
      IVar1 = pCVar3->use_as;
      pmVar4->type = pCVar3->type;
      pmVar4->use_as = IVar1;
      in_RAX = local_128 + 0x10;
      if ((undefined1 *)CONCAT44(local_128._4_4_,local_128._0_4_) != in_RAX) {
        operator_delete((undefined1 *)CONCAT44(local_128._4_4_,local_128._0_4_));
        in_RAX = extraout_RAX_00;
      }
      lVar8 = lVar8 + lVar5 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  uVar7 = (ulong)puVar6[lVar8];
  lVar8 = lVar8 + 1;
  if (uVar7 != 0) {
    do {
      r_code::ReadString_abi_cxx11_((uint *)local_128);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,CONCAT44(local_128._4_4_,local_128._0_4_),
                 (char *)(local_128._8_8_ + CONCAT44(local_128._4_4_,local_128._0_4_)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->class_names).m_vector,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      lVar5 = r_code::GetStringSize((string *)local_128);
      in_RAX = local_128 + 0x10;
      if ((undefined1 *)CONCAT44(local_128._4_4_,local_128._0_4_) != in_RAX) {
        operator_delete((undefined1 *)CONCAT44(local_128._4_4_,local_128._0_4_));
        in_RAX = extraout_RAX_01;
      }
      lVar8 = lVar8 + lVar5;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  uVar7 = (ulong)puVar6[lVar8];
  lVar8 = lVar8 + 1;
  if (uVar7 != 0) {
    do {
      r_code::ReadString_abi_cxx11_((uint *)local_128);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,CONCAT44(local_128._4_4_,local_128._0_4_),
                 (char *)(local_128._8_8_ + CONCAT44(local_128._4_4_,local_128._0_4_)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->operator_names).m_vector,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      lVar5 = r_code::GetStringSize((string *)local_128);
      in_RAX = local_128 + 0x10;
      if ((undefined1 *)CONCAT44(local_128._4_4_,local_128._0_4_) != in_RAX) {
        operator_delete((undefined1 *)CONCAT44(local_128._4_4_,local_128._0_4_));
        in_RAX = extraout_RAX_02;
      }
      lVar8 = lVar8 + lVar5;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  uVar7 = (ulong)puVar6[lVar8];
  if (uVar7 != 0) {
    do {
      r_code::ReadString_abi_cxx11_((uint *)local_128);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,CONCAT44(local_128._4_4_,local_128._0_4_),
                 (char *)(local_128._8_8_ + CONCAT44(local_128._4_4_,local_128._0_4_)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->function_names).m_vector,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      r_code::GetStringSize((string *)local_128);
      in_RAX = local_128 + 0x10;
      if ((undefined1 *)CONCAT44(local_128._4_4_,local_128._0_4_) != in_RAX) {
        operator_delete((undefined1 *)CONCAT44(local_128._4_4_,local_128._0_4_));
        in_RAX = extraout_RAX_03;
      }
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return (ssize_t)in_RAX;
}

Assistant:

void Metadata::read(uint32_t *data, size_t size)
{
    size_t class_count = data[0];
    size_t i;
    size_t offset = 1;

    for (i = 0; i < class_count; ++i) {
        Class c;
        c.read(data + offset);
        classes_by_opcodes.push_back(c);
        offset += c.get_size();
    }

    size_t classes_count = data[offset++];

    for (i = 0; i < classes_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        offset += r_code::GetStringSize(name);
        classes[name] = classes_by_opcodes[data[offset++]];
    }

    size_t sys_classes_count = data[offset++];

    for (i = 0; i < sys_classes_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        offset += r_code::GetStringSize(name);
        sys_classes[name] = classes_by_opcodes[data[offset++]];
    }

    size_t class_names_count = data[offset++];

    for (i = 0; i < class_names_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        class_names.push_back(name);
        offset += r_code::GetStringSize(name);
    }

    size_t operator_names_count = data[offset++];

    for (i = 0; i < operator_names_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        operator_names.push_back(name);
        offset += r_code::GetStringSize(name);
    }

    size_t function_names_count = data[offset++];

    for (i = 0; i < function_names_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        function_names.push_back(name);
        offset += r_code::GetStringSize(name);
    }
}